

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall
backend::codegen::RegAllocator::replace_write::anon_class_16_2_94732020::operator()
          (anon_class_16_2_94732020 *this)

{
  uint r;
  ostream *poVar1;
  Tag *in_RSI;
  Function *pFVar2;
  Tag *tag;
  allocator<char> local_fb;
  allocator<char> local_fa;
  ostream local_f9;
  string local_f8;
  undefined1 local_d8 [80];
  undefined **local_88;
  undefined8 local_80;
  undefined1 local_78;
  Function local_70;
  
  local_f9 = (ostream)0x0;
  AixLog::operator<<(&local_f9,(Severity *)in_RSI);
  AixLog::Tag::Tag((Tag *)(local_d8 + 0x20));
  AixLog::operator<<((ostream *)(local_d8 + 0x20),in_RSI);
  local_80 = std::chrono::_V2::system_clock::now();
  local_88 = &PTR__Timestamp_001d8f28;
  local_78 = 0;
  AixLog::operator<<((ostream *)&local_88,(Timestamp *)in_RSI);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"operator()",&local_fa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,&local_fb);
  pFVar2 = (Function *)local_d8;
  AixLog::Function::Function(&local_70,(string *)pFVar2,&local_f8,0x2f1);
  AixLog::operator<<((ostream *)&local_70,pFVar2);
  r = this->r->from;
  tag = (Tag *)(ulong)r;
  arm::display_reg_name((ostream *)&std::clog,r);
  AixLog::Function::~Function(&local_70);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_d8);
  AixLog::Tag::~Tag((Tag *)(local_d8 + 0x20));
  local_f9 = (ostream)0x0;
  AixLog::operator<<(&local_f9,(Severity *)tag);
  AixLog::Tag::Tag((Tag *)(local_d8 + 0x20));
  AixLog::operator<<((ostream *)(local_d8 + 0x20),tag);
  local_80 = std::chrono::_V2::system_clock::now();
  local_88 = &PTR__Timestamp_001d8f28;
  local_78 = 0;
  AixLog::operator<<((ostream *)&local_88,(Timestamp *)tag);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"operator()",&local_fa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
             ,&local_fb);
  pFVar2 = (Function *)local_d8;
  AixLog::Function::Function(&local_70,(string *)pFVar2,&local_f8,0x2f2);
  AixLog::operator<<((ostream *)&local_70,pFVar2);
  poVar1 = std::operator<<((ostream *)&std::clog," at: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*this->i);
  std::operator<<(poVar1," ");
  AixLog::Function::~Function(&local_70);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)local_d8);
  AixLog::Tag::~Tag((Tag *)(local_d8 + 0x20));
  return;
}

Assistant:

void RegAllocator::replace_write(ReplaceWriteAction r, int i) {
  auto disp_reg = [&]() {
    display_reg_name(LOG(TRACE), r.from);
    LOG(TRACE) << " at: " << i << " ";
  };
  if (r.kind == ReplaceWriteKind::Phys) {
    // is physical register; mark as occupied
    active.insert({r.replace_with, Interval(i, UINT32_MAX)});
    disp_reg();
    LOG(TRACE) << "phys " << r.replace_with << std::endl;
    return;
  } else if (r.kind == ReplaceWriteKind::Graph) {
    // This register is allocated with graph-coloring
    disp_reg();
    LOG(TRACE) << "graph" << std::endl;
  } else if (r.kind == ReplaceWriteKind::Spill) {
    // this register is allocated in stack
    Reg rd = r.replace_with;
    int pos = get_or_alloc_spill_pos(r.from);

    bool del = false;
    if (inst_sink.size() > 0) {
      auto &x = inst_sink.back();
      if (auto x_ = dynamic_cast<LoadStoreInst *>(&*x)) {
        if (auto x__ = std::get_if<MemoryOperand>(&x_->mem);
            x_->op == arm::OpCode::StR && x__->r1 == rd &&
            x_->cond == cur_cond &&
            (*x__) == MemoryOperand(REG_SP, pos + stack_offset)) {
          del = true;
        }
      }
    }
    if (!del) {
      inst_sink.push_back(std::make_unique<LoadStoreInst>(
          OpCode::StR, rd, MemoryOperand(REG_SP, pos + stack_offset),
          cur_cond));
    }
    wrote_to.erase(r.from);
    disp_reg();
    LOG(TRACE) << "spill " << pos << " " << del << std::endl;
  } else {
    disp_reg();
    LOG(TRACE) << "temp" << std::endl;
    // Is temporary register
    // the register should already be written to or read from

    // throw new std::logic_error("Writing to transient register");
  }
}